

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUnate.c
# Opt level: O0

void Abc_NtkPrintUnate(Abc_Ntk_t *pNtk,int fUseBdds,int fUseNaive,int fVerbose)

{
  int fVerbose_local;
  int fUseNaive_local;
  int fUseBdds_local;
  Abc_Ntk_t *pNtk_local;
  
  if ((fUseBdds == 0) && (fUseNaive == 0)) {
    Abc_NtkPrintUnateSat(pNtk,fVerbose);
  }
  else {
    Abc_NtkPrintUnateBdd(pNtk,fUseNaive,fVerbose);
  }
  return;
}

Assistant:

void Abc_NtkPrintUnate( Abc_Ntk_t * pNtk, int fUseBdds, int fUseNaive, int fVerbose )
{
    if ( fUseBdds || fUseNaive )
        Abc_NtkPrintUnateBdd( pNtk, fUseNaive, fVerbose );
    else
        Abc_NtkPrintUnateSat( pNtk, fVerbose );
}